

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

int __thiscall
djb::fresnel::unpolarized::clone
          (unpolarized *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  unpolarized *this_00;
  unpolarized *this_local;
  
  this_00 = (unpolarized *)operator_new(0x18);
  unpolarized(this_00,this);
  return (int)this_00;
}

Assistant:

impl *clone() const {return new unpolarized(*this);}